

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslserver.cpp
# Opt level: O3

void QSslServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  void *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined4 *local_20;
  void *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == IndexOfMethod) {
      pcVar1 = *_a[1];
      lVar2 = *(long *)((long)_a[1] + 8);
      if (pcVar1 == sslErrors && lVar2 == 0) {
        *(undefined4 *)*_a = 0;
      }
      else if (pcVar1 == peerVerifyError && lVar2 == 0) {
        *(undefined4 *)*_a = 1;
      }
      else if (pcVar1 == errorOccurred && lVar2 == 0) {
        *(undefined4 *)*_a = 2;
      }
      else if (pcVar1 == preSharedKeyAuthenticationRequired && lVar2 == 0) {
        *(undefined4 *)*_a = 3;
      }
      else if (pcVar1 == alertSent && lVar2 == 0) {
        *(undefined4 *)*_a = 4;
      }
      else if (pcVar1 == alertReceived && lVar2 == 0) {
        *(undefined4 *)*_a = 5;
      }
      else if (pcVar1 == handshakeInterruptedOnError && lVar2 == 0) {
        *(undefined4 *)*_a = 6;
      }
      else if (pcVar1 == startedEncryptionHandshake && lVar2 == 0) {
        *(undefined4 *)*_a = 7;
      }
    }
    else if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        local_28 = (undefined8 *)_a[2];
        local_40 = *_a[1];
        iVar5 = 0;
        break;
      case 1:
        local_28 = (undefined8 *)_a[2];
        local_40 = *_a[1];
        iVar5 = 1;
        break;
      case 2:
        local_40 = *_a[1];
        local_28 = &local_50;
        local_50 = CONCAT44(local_50._4_4_,*_a[2]);
        iVar5 = 2;
        break;
      case 3:
        local_40 = *_a[1];
        local_50 = *_a[2];
        local_28 = &local_50;
        iVar5 = 3;
        break;
      case 4:
        local_40 = *_a[1];
        local_44 = *_a[3];
        local_18 = _a[4];
        local_28 = &local_50;
        local_50 = CONCAT44(local_50._4_4_,*_a[2]);
        local_20 = &local_44;
        iVar5 = 4;
        break;
      case 5:
        local_40 = *_a[1];
        local_44 = *_a[3];
        local_18 = _a[4];
        local_28 = &local_50;
        local_50 = CONCAT44(local_50._4_4_,*_a[2]);
        local_20 = &local_44;
        iVar5 = 5;
        break;
      case 6:
        local_28 = (undefined8 *)_a[2];
        local_40 = *_a[1];
        iVar5 = 6;
        break;
      case 7:
        local_40 = *_a[1];
        iVar5 = 7;
        break;
      default:
        goto switchD_002526e1_default;
      }
      local_30 = &local_40;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_38);
    }
    goto switchD_002526e1_default;
  }
  switch(_id) {
  case 0:
    puVar3 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
LAB_0025276d:
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslSocket_*>::metaType;
    }
    else {
      if (*_a[1] != 1) break;
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
    }
LAB_00252774:
    *puVar3 = pIVar4;
    goto switchD_002526e1_default;
  case 1:
  case 4:
  case 5:
  case 6:
  case 7:
    puVar3 = (undefined8 *)*_a;
    if (*_a[1] == 0) goto LAB_0025276d;
    break;
  case 2:
    puVar3 = (undefined8 *)*_a;
    if (*_a[1] == 0) goto LAB_0025276d;
    if (*_a[1] == 1) {
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
      goto LAB_00252774;
    }
    break;
  case 3:
    puVar3 = (undefined8 *)*_a;
    if (*_a[1] == 0) goto LAB_0025276d;
    if (*_a[1] == 1) {
      pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
      goto LAB_00252774;
    }
    break;
  default:
    puVar3 = (undefined8 *)*_a;
  }
  *puVar3 = 0;
switchD_002526e1_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 2: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[2]))); break;
        case 3: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 4: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 5: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 6: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 7: _t->startedEncryptionHandshake((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QList<QSslError> & )>(_a, &QSslServer::sslErrors, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QAbstractSocket::SocketError )>(_a, &QSslServer::errorOccurred, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSslPreSharedKeyAuthenticator * )>(_a, &QSslServer::preSharedKeyAuthenticationRequired, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertReceived, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::handshakeInterruptedOnError, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * )>(_a, &QSslServer::startedEncryptionHandshake, 7))
            return;
    }
}